

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<unsigned_long_long>::data(QList<unsigned_long_long> *this)

{
  QArrayDataPointer<unsigned_long_long> *this_00;
  unsigned_long_long *puVar1;
  QArrayDataPointer<unsigned_long_long> *in_RDI;
  
  detach((QList<unsigned_long_long> *)0x157b1c);
  this_00 = (QArrayDataPointer<unsigned_long_long> *)
            QArrayDataPointer<unsigned_long_long>::operator->(in_RDI);
  puVar1 = QArrayDataPointer<unsigned_long_long>::data(this_00);
  return puVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }